

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirDEFDEVICE(void)

{
  pointer ppCVar1;
  aint slot_size;
  aint page_count;
  bool bVar2;
  size_t i;
  char *pcVar3;
  CDeviceDef *pCVar4;
  long lVar5;
  long lVar6;
  int badValue;
  int iVar7;
  __normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_> _Var8;
  int32_t i_1;
  __normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_> __it;
  char *id;
  CDeviceDef *local_550;
  bool optional [258];
  aint args [258];
  
  pcVar3 = GetID(&lp);
  ppCVar1 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  id = pcVar3;
  if (pcVar3 == (char *)0x0) {
    Error("[DEFDEVICE] expected syntax is <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]"
          ,bp,SUPPRESS);
    return;
  }
  args._0_8_ = &id;
  lVar5 = (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  __it._M_current =
       DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (lVar6 = lVar5 >> 5; 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<dirDEFDEVICE()::$_0>::operator()
                      ((_Iter_pred<dirDEFDEVICE()::__0> *)args,__it);
    _Var8._M_current = __it._M_current;
    if (bVar2) goto LAB_001100c2;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<dirDEFDEVICE()::$_0>::operator()
                      ((_Iter_pred<dirDEFDEVICE()::__0> *)args,
                       (__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                        )(__it._M_current + 1));
    _Var8._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_001100c2;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<dirDEFDEVICE()::$_0>::operator()
                      ((_Iter_pred<dirDEFDEVICE()::__0> *)args,
                       (__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                        )(__it._M_current + 2));
    _Var8._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_001100c2;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<dirDEFDEVICE()::$_0>::operator()
                      ((_Iter_pred<dirDEFDEVICE()::__0> *)args,
                       (__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                        )(__it._M_current + 3));
    _Var8._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_001100c2;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var8._M_current = ppCVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<dirDEFDEVICE()::$_0>::operator()
                            ((_Iter_pred<dirDEFDEVICE()::__0> *)args,__it),
         _Var8._M_current = __it._M_current, bVar2)) goto LAB_001100c2;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<dirDEFDEVICE()::$_0>::operator()
                      ((_Iter_pred<dirDEFDEVICE()::__0> *)args,__it);
    _Var8._M_current = __it._M_current;
    if (bVar2) goto LAB_001100c2;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<dirDEFDEVICE()::$_0>::operator()
                    ((_Iter_pred<dirDEFDEVICE()::__0> *)args,__it);
  _Var8._M_current = __it._M_current;
  if (!bVar2) {
    _Var8._M_current = ppCVar1;
  }
LAB_001100c2:
  if (pass < 2 && _Var8._M_current == ppCVar1) {
    memset(args,0,0x408);
    memset(optional,0,0x102);
    for (lVar5 = 2; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      args[lVar5] = -1;
      optional[lVar5] = true;
    }
    bVar2 = anyComma(&lp);
    pcVar3 = 
    "[DEFDEVICE] expected syntax is <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]"
    ;
    if ((bVar2) && (bVar2 = getIntArguments<258>(&lp,&args,&optional), bVar2)) {
      slot_size = args[0];
      page_count = args[1];
      if (0 < args[1] && 0xffff00fe < args[0] - 0x10001U) {
        pCVar4 = (CDeviceDef *)operator_new(0x418);
        CDeviceDef::CDeviceDef(pCVar4,id,slot_size,page_count);
        local_550 = pCVar4;
        std::vector<CDeviceDef*,std::allocator<CDeviceDef*>>::emplace_back<CDeviceDef*>
                  ((vector<CDeviceDef*,std::allocator<CDeviceDef*>> *)&DefDevices,&local_550);
        pCVar4 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
        lVar5 = 0;
        iVar7 = -1;
        do {
          if (pCVar4->SlotsCount <= lVar5) {
            return;
          }
          badValue = args[lVar5 + 2];
          if (badValue < 0) {
            if (badValue != -1) goto LAB_00110242;
LAB_0011024c:
            badValue = (uint)(iVar7 < pCVar4->PagesCount + -1) + iVar7;
          }
          else if (pCVar4->PagesCount <= badValue) {
LAB_00110242:
            ErrorInt("[DEFDEVICE] invalid initial page",badValue,EARLY);
            goto LAB_0011024c;
          }
          pCVar4->initialPages[lVar5] = badValue;
          lVar5 = lVar5 + 1;
          iVar7 = badValue;
        } while( true );
      }
      pcVar3 = "[DEFDEVICE] valid slot_size: 256..64ki, page_count: 1 or more";
    }
    Error(pcVar3,bp,EARLY);
  }
  else {
    if (pass < 2) {
      Error("[DEFDEVICE] device with such ID is already defined",pcVar3,EARLY);
    }
    SkipToEol(&lp);
  }
  return;
}

Assistant:

static void dirDEFDEVICE() {
	//DEFDEVICE <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]
	const char* id = GetID(lp);
	if (!id) {
		Error(DEFDEVICE_SYNTAX_ERR, bp, SUPPRESS);
		return;
	}

	const bool is_defined = std::any_of(
		DefDevices.begin(), DefDevices.end(),
		[&](const CDeviceDef* el) { return 0 == strcasecmp(id, el->getID()); }
	);
	if (is_defined || 1 < pass) {
		// same id defined twice during first pass?
		if (pass <= 1) Error("[DEFDEVICE] device with such ID is already defined", id, EARLY);
		// in later passes ignore the line, DEFDEVICE works only in first pass
		SkipToEol(lp);
		return;
	}

	// add new definition if arguments are correct and this is first pass
	aint args[2 + CDeviceDef::MAX_SLOT_N] = {};	// slot_size, page_count, initial pages, ...
	bool optional[2 + CDeviceDef::MAX_SLOT_N] = {false, false};
	aint &slot_size = args[0], &page_count = args[1], *initial_pages = args + 2;
	for (size_t i = 2; i < CDeviceDef::MAX_SLOT_N; ++i) {
		args[i] = -1;
		optional[i] = true;
	}
	if (!anyComma(lp) || !getIntArguments<2 + CDeviceDef::MAX_SLOT_N>(lp, args, optional)) {
		Error(DEFDEVICE_SYNTAX_ERR, bp, EARLY);
		return;
	}
	if (slot_size < 256 || 0x10000 < slot_size || page_count <= 0) {
		Error("[DEFDEVICE] valid slot_size: 256..64ki, page_count: 1 or more", bp, EARLY);
		return;
	}
	DefDevices.push_back(new CDeviceDef(id, slot_size, page_count));

	// init "initialPages array by going 0, 1, 2, ..., page_count-1, page_count-1, ... or parsed explicit values
	CDeviceDef & dev = *DefDevices.back();
	int previous_page = -1;
	for (int32_t i = 0; i < dev.SlotsCount; ++i) {
		if (0 <= initial_pages[i] && initial_pages[i] < dev.PagesCount) {
			previous_page = initial_pages[i];
		} else {
			if (-1 != initial_pages[i]) ErrorInt("[DEFDEVICE] invalid initial page", initial_pages[i], EARLY);
			if (previous_page < dev.PagesCount - 1) ++previous_page;
		}
		dev.initialPages[i] = previous_page;
	}
}